

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall
preprocessor_test_arguments_Test::preprocessor_test_arguments_Test
          (preprocessor_test_arguments_Test *this)

{
  preprocessor_test *in_RDI;
  
  preprocessor_test::preprocessor_test(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__preprocessor_test_arguments_Test_0018df68;
  return;
}

Assistant:

TEST_F(preprocessor_test, arguments)
{
	size_t first_remove[] = { PREPROCESSOR_ARGS_FIRST_REMOVE(1, 2, 3, 4) };

	size_t second_remove[] = { PREPROCESSOR_ARGS_SECOND_REMOVE(1, 2, 3, 4) };

	EXPECT_EQ((int)1, (int)PREPROCESSOR_ARGS_FIRST(1, 2, 3, 4, 5, 6));

	EXPECT_EQ((size_t)first_remove[0], (size_t)2);

	EXPECT_EQ((size_t)first_remove[1], (size_t)3);

	EXPECT_EQ((size_t)first_remove[2], (size_t)4);

	EXPECT_EQ((int)2, (int)PREPROCESSOR_ARGS_SECOND(1, 2, 3, 4, 5, 6));

	EXPECT_EQ((size_t)second_remove[0], (size_t)1);

	EXPECT_EQ((size_t)second_remove[1], (size_t)3);

	EXPECT_EQ((size_t)second_remove[2], (size_t)4);

	EXPECT_EQ((int)0, (int)PREPROCESSOR_ARGS_COUNT());

	EXPECT_EQ((int)1, (int)PREPROCESSOR_ARGS_COUNT(a));

	EXPECT_EQ((int)2, (int)PREPROCESSOR_ARGS_COUNT(a, b));

	EXPECT_EQ((int)3, (int)PREPROCESSOR_ARGS_COUNT(a, b, c));

	EXPECT_EQ((int)4, (int)PREPROCESSOR_ARGS_COUNT(a, b, c, d));

	EXPECT_EQ((int)0, (int)PREPROCESSOR_ARGS_COUNT(/* ... */));
}